

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

char * __thiscall
ON_Locale::GetAppleLanguageName(ON_Locale *this,char *buffer,size_t buffer_capacity)

{
  bool bVar1;
  char *dest;
  char *string2;
  char *pcVar2;
  
  if (buffer == (char *)0x0 || buffer_capacity == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    memset(buffer,0,buffer_capacity);
    pcVar2 = buffer + buffer_capacity;
  }
  dest = LocaleStringBuilder('\0',this->m_language_subtag,9,buffer,pcVar2);
  bVar1 = ON_String::EqualOrdinal("zh",3,buffer,3,true);
  string2 = this->m_region_subtag;
  if ((!bVar1) && (this->m_region_subtag[0] == '\0')) goto LAB_004e74ad;
  if (this->m_script_subtag[0] == '\0') {
    bVar1 = ON_String::EqualOrdinal("CN",-1,string2,-1,true);
    if (bVar1) {
      string2 = "Hans";
      goto LAB_004e74ad;
    }
    bVar1 = ON_String::EqualOrdinal("TW",-1,string2,-1,true);
    if (bVar1) {
      string2 = "Hant";
      goto LAB_004e74ad;
    }
  }
  dest = LocaleStringBuilder('-',this->m_script_subtag,5,dest,pcVar2);
LAB_004e74ad:
  pcVar2 = LocaleStringBuilder('-',string2,5,dest,pcVar2);
  if (pcVar2 == (char *)0x0) {
    buffer = (char *)0x0;
  }
  return buffer;
}

Assistant:

const char* ON_Locale::GetAppleLanguageName(
  char* buffer,
  size_t buffer_capacity
  ) const
{
  char* buffer_end = LocaleStringBuilderDestEnd(buffer,buffer_capacity);
  char* s = buffer;
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG(0,m_language_subtag),s,buffer_end);
  if ( ON_String::EqualOrdinal("zh", 3, buffer, 3, true) || 0 != m_region_subtag[0] )
  {
    // Apple "language" names use "zh-Hans" for "zh-CN" and "zh-Hant" for "zh-TW"
    if ( 0 == m_script_subtag[0] )
    {
      const char* script_subtag = nullptr;
      if ( ON_String::EqualOrdinal("CN", -1, m_region_subtag, -1, true))
        script_subtag = "Hans";
      else if (ON_String::EqualOrdinal("TW", -1, m_region_subtag, -1, true))
        script_subtag = "Hant";
      if (0 != script_subtag)
      {
        s = LocaleStringBuilder('-', script_subtag, 5, s, buffer_end);
        return (nullptr == s) ? nullptr : buffer;
      }
    }
    s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_script_subtag), s, buffer_end);
  }
  s = LocaleStringBuilder(ON_LOCALE_SUBTAG('-', m_region_subtag), s, buffer_end);
  return ( nullptr == s ) ? nullptr : buffer;
}